

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

void icu_63::millisToOffset(int32_t millis,UnicodeString *str)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  UChar local_24;
  UChar local_22;
  
  uVar3 = (ulong)(uint)millis;
  uVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
  uVar2 = 2;
  if ((uVar1 & 1) == 0) {
    uVar2 = uVar1 & 0x1e;
  }
  (str->fUnion).fStackFields.fLengthAndFlags = uVar2;
  if (millis < 0) {
    UnicodeString::doAppend(str,&local_22,0,1);
    uVar3 = (ulong)(uint)-millis;
  }
  else {
    UnicodeString::doAppend(str,&local_24,0,1);
  }
  appendAsciiDigits((int32_t)(uVar3 / 3600000),'\x02',str);
  appendAsciiDigits((int)(uVar3 / 60000) + (((uint)(uVar3 / 60000) & 0xffff) / 0x3c) * -0x3c &
                    0xffff,'\x02',str);
  appendAsciiDigits((int)(uVar3 / 1000) + (int)(uVar3 / 60000) * -0x3c,'\x02',str);
  return;
}

Assistant:

static void millisToOffset(int32_t millis, UnicodeString& str) {
    str.remove();
    if (millis >= 0) {
        str.append(PLUS);
    } else {
        str.append(MINUS);
        millis = -millis;
    }
    int32_t hour, min, sec;
    int32_t t = millis / 1000;

    sec = t % 60;
    t = (t - sec) / 60;
    min = t % 60;
    hour = t / 60;

    appendAsciiDigits(hour, 2, str);
    appendAsciiDigits(min, 2, str);
    appendAsciiDigits(sec, 2, str);
}